

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

void __thiscall
embree::CoronaLoader::loadMaterialDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  int iVar1;
  mapped_type *pmVar2;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  string name;
  undefined1 local_80 [32];
  string local_60;
  string local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)&xml->ptr->name);
  if (iVar1 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_80._0_8_ = *plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_80._0_8_ == psVar5) {
      local_80._16_8_ = *psVar5;
      local_80._24_8_ = plVar4[3];
      local_80._0_8_ = local_80 + 0x10;
    }
    else {
      local_80._16_8_ = *psVar5;
    }
    local_80._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &xml->ptr->name);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = xml->ptr;
  if ((long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    local_80._8_8_ = 4;
    local_80._16_5_ = 0x656d616e;
    local_80._0_8_ = (MaterialNode *)(local_80 + 0x10);
    XML::parm(&local_60,this_00,(string *)local_80);
    if ((MaterialNode *)local_80._0_8_ != (MaterialNode *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_);
    }
    loadMaterial((CoronaLoader *)local_80,(Ref<embree::XML> *)this);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
             ::operator[](&this->materialMap,&local_60);
    if (pmVar2->ptr != (MaterialNode *)0x0) {
      (*(pmVar2->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    pmVar2->ptr = (MaterialNode *)local_80._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)local_80,&xml->ptr->loc);
  plVar4 = (long *)std::__cxx11::string::append(local_80);
  local_60._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar5) {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60.field_2._8_8_ = plVar4[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar5;
  }
  local_60._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_60);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoronaLoader::loadMaterialDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "materialDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition");

    const std::string name = xml->parm("name");
    materialMap[name] = loadMaterial(xml->children[0]);
  }